

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
::addObject(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            *this,string *name,
           shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *obj,char type)

{
  int iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar2;
  initializer_list<char> __l;
  allocator_type local_42;
  char local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
                        *)&this->objectMap,name,obj);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __l._M_len = 1;
      __l._M_array = &local_41;
      local_41 = type;
      std::vector<char,_std::allocator<char>_>::vector(&local_40,__l,&local_42);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::vector<char,std::allocator<char>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
                  *)&this->typeMap,name,&local_40);
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return (bool)(pVar2.second & 1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool addObject(const std::string& name, std::shared_ptr<X> obj, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto res = objectMap.emplace(name, std::move(obj));
        if (res.second) {
            typeMap.emplace(name, std::vector<Y>{type});
        }
        return res.second;
    }